

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppuVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  _Ios_Openmode _Var3;
  CURLcode CVar4;
  ostream *poVar5;
  reference pvVar6;
  ulong uVar7;
  ulong number;
  ulong uVar8;
  uint64_t presentation_time;
  ulong uVar9;
  uint64_t presentation_time_00;
  ulong uVar10;
  uint64_t seg_start_00;
  uint64_t seg_end_00;
  void *this;
  long lVar11;
  uint64_t presentation_time_01;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  string local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  undefined1 local_b30 [8];
  string uri_vtt_h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  string local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  undefined1 local_a50 [8];
  string uri_h;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vtt_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_bytes;
  DASHEventMessageBoxv1 ev_1;
  DASHEventMessageBoxv1 ev;
  DASHEventMessageBoxv1 ev_vtt;
  undefined1 local_770 [4];
  uint off;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_vtt_list;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_emsg_list;
  uint64_t seg_end;
  uint64_t seg_start;
  uint64_t ad_end_next;
  uint64_t ad_start_next;
  uint64_t ad_end_last;
  uint64_t ad_start_last;
  uint64_t next_K;
  uint64_t t_d;
  duration<long,_std::ratio<1L,_1000000000L>_> local_6f8;
  duration<long,_std::ratio<1L,_1000L>_> local_6f0;
  rep local_6e8;
  rep t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  allocator<char> local_619;
  undefined1 local_618 [8];
  string out_meta;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes_vtt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes;
  undefined1 local_5a8 [8];
  fstream oft_vtt;
  char local_598 [512];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  fstream oft;
  char local_368 [519];
  allocator<char> local_161;
  undefined1 local_160 [8];
  string vtt_track;
  undefined1 local_138 [8];
  string event_track;
  uint64_t next_L;
  uint64_t last_L;
  string uri_vtt;
  string uri;
  uint64_t last_K;
  undefined1 local_b0 [8];
  push_marker_options_t opts;
  char **argv_local;
  int argc_local;
  undefined4 uVar15;
  
  opts.media_string_.field_2._8_8_ = argv;
  push_marker_options_t::push_marker_options_t((push_marker_options_t *)local_b0);
  push_marker_options_t::parse_options
            ((push_marker_options_t *)local_b0,argc,(char **)opts.media_string_.field_2._8_8_);
  if (((opts.track_id_._1_1_ & 1) == 0) && (((byte)opts.track_id_ & 1) == 0)) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "not configured to send event track or vtt track, use option --vtt when setting option --no_event"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    push_marker_options_t::~push_marker_options_t((push_marker_options_t *)local_b0);
    return 0;
  }
  uri.field_2._8_8_ = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&uri_vtt.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "/Streams(out_meta.cmfm)");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&last_L,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "/Streams(out_vtt.cmft)");
  event_track.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"events",(allocator<char> *)(vtt_track.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(vtt_track.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"vtt_time",&local_161);
  std::allocator<char>::~allocator(&local_161);
  std::operator+(&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 ".cmfm");
  _Var3 = std::operator|(_S_bin,_S_out);
  std::fstream::fstream(local_378,(string *)&local_398,_Var3);
  std::__cxx11::string::~string((string *)&local_398);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 ".cmft");
  _Var3 = std::operator|(_S_bin,_S_out);
  std::fstream::fstream
            (local_5a8,
             (string *)
             &header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,_Var3);
  std::__cxx11::string::~string
            ((string *)
             &header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&out_meta.field_2 + 8))
  ;
  if ((opts.track_id_._1_1_ & 1) != 0) {
    ::event_track::get_meta_header_bytes
              ((uint32_t)opts.avail_dur_,opts.avail_dur_._4_4_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,false);
  }
  if (((byte)opts.track_id_ & 1) != 0) {
    ::event_track::get_meta_header_bytes
              ((uint32_t)opts.avail_dur_ + 1,opts.avail_dur_._4_4_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&out_meta.field_2 + 8),true);
  }
  if ((opts.url_.field_2._M_local_buf[8] & 1U) == 0) {
    if ((opts.track_id_._1_1_ & 1) != 0) {
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < 2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"posting event segment to: ");
        poVar5 = std::operator<<(poVar5,(string *)(uri_vtt.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)((long)&uri_vtt.field_2 + 8),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &header_bytes_vtt.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (CVar4 != CURLE_OK) {
          exit(1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_618,"events",&local_619);
        std::allocator<char>::~allocator(&local_619);
        std::operator+(&local_660,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"/");
        get_path_from_template(&local_680,(string *)&opts.send_vtt_,(string *)local_618,0,0);
        std::operator+(&local_640,&local_660,&local_680);
        std::__cxx11::string::operator=
                  ((string *)(uri_vtt.field_2._M_local_buf + 8),(string *)&local_640);
        std::__cxx11::string::~string((string *)&local_640);
        std::__cxx11::string::~string((string *)&local_680);
        std::__cxx11::string::~string((string *)&local_660);
        poVar5 = std::operator<<((ostream *)&std::cout,"posting event segment to: ");
        poVar5 = std::operator<<(poVar5,(string *)(uri_vtt.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)((long)&uri_vtt.field_2 + 8),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &header_bytes_vtt.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (CVar4 != CURLE_OK) {
          exit(1);
        }
        std::__cxx11::string::~string((string *)local_618);
      }
    }
    if (((byte)opts.track_id_ & 1) != 0) {
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < 2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"posting \'vttt segment to: ");
        poVar5 = std::operator<<(poVar5,(string *)&last_L);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)&last_L,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&out_meta.field_2 + 8));
        if (CVar4 != CURLE_OK) {
          exit(1);
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"posting \'vttt segment to: ");
        poVar5 = std::operator<<(poVar5,(string *)&last_L);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::operator+(&local_6c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"/");
        get_path_from_template((string *)&t,(string *)&opts.send_vtt_,(string *)local_160,0,0);
        std::operator+(&local_6a0,&local_6c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
        std::__cxx11::string::operator=((string *)&last_L,(string *)&local_6a0);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::__cxx11::string::~string((string *)&t);
        std::__cxx11::string::~string((string *)&local_6c0);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)&last_L,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&out_meta.field_2 + 8));
        if (CVar4 != CURLE_OK) {
          exit(1);
        }
      }
    }
  }
  else {
    if ((opts.track_id_._1_1_ & 1) != 0) {
      ppuVar1 = &header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::ostream::write(local_368,(long)pvVar6);
    }
    if (((byte)opts.track_id_ & 1) != 0) {
      pvVar2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&out_meta.field_2 + 8);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar2,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
      std::ostream::write(local_598,(long)pvVar6);
    }
  }
  do {
    do {
      t_d = std::chrono::_V2::system_clock::now();
      local_6f8.__r =
           (rep)std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&t_d);
      local_6f0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_6f8);
      local_6e8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_6f0);
      uVar7 = local_6e8 + opts._32_8_;
      uVar15 = (undefined4)(uVar7 >> 0x20);
      auVar13._8_4_ = uVar15;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(opts.announce_ >> 0x20);
      auVar16._0_8_ = opts.announce_;
      auVar16._12_4_ = 0x45300000;
      dVar12 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
                    ((auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)opts.announce_) - 4503599627370496.0)));
      number = (long)dVar12 | (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f;
      auVar14._8_4_ = uVar15;
      auVar14._0_8_ = uVar7;
      auVar14._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)(opts.seg_dur_ >> 0x20);
      auVar17._0_8_ = opts.seg_dur_;
      auVar17._12_4_ = 0x45300000;
      dVar12 = floor(((auVar14._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
                     ((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)opts.seg_dur_) - 4503599627370496.0)));
      uVar8 = (long)dVar12 | (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f;
      presentation_time = uVar8 * opts.seg_dur_;
      uVar9 = presentation_time + opts.avail_interval_;
      presentation_time_00 = (uVar8 + 1) * opts.seg_dur_;
      uVar10 = presentation_time_00 + opts.avail_interval_;
    } while (number == uri.field_2._8_8_);
    seg_start_00 = number * opts.announce_;
    seg_end_00 = opts.announce_ + seg_start_00;
    poVar5 = std::operator<<((ostream *)&std::cout," next_K is : ");
    this = (void *)std::ostream::operator<<(poVar5,number);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              *)&in_vtt_list.
                 super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              *)local_770);
    if (((byte)opts.track_id_ & 1) != 0) {
      for (ev_vtt.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          ev_vtt.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < opts.announce_;
          ev_vtt.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ev_vtt.message_data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 100) {
        presentation_time_01 =
             number * opts.announce_ +
             (ulong)ev_vtt.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
        generate_event_message_vtt_time
                  ((DASHEventMessageBoxv1 *)
                   &ev.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(uint32_t)presentation_time_01,
                   presentation_time_01,100,1000,
                   ev_vtt.message_data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
        std::
        vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
        ::push_back((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     *)local_770,
                    (value_type *)
                    &ev.message_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                  ((DASHEventMessageBoxv1 *)
                   &ev.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    if ((opts.track_id_._1_1_ & 1) != 0) {
      next_L._0_4_ = (uint32_t)uVar8;
      if ((uVar7 < uVar9) && (presentation_time - opts.avail_interval_ <= uVar7)) {
        generate_event_message_splice_insert
                  ((DASHEventMessageBoxv1 *)
                   &ev_1.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(uint32_t)next_L,presentation_time,
                   opts.avail_interval_,opts.avail_dur_._4_4_,(bool)(opts.track_id_._2_1_ & 1));
        poVar5 = std::operator<<((ostream *)&std::cout," === ad slot is active == ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::
        vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
        ::push_back((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     *)&in_vtt_list.
                        super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)
                    &ev_1.message_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                  ((DASHEventMessageBoxv1 *)
                   &ev_1.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      if ((uVar7 < uVar10) && (presentation_time_00 - opts.avail_interval_ <= uVar7)) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 " == ad slot is active, pushing segment with markers == ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        generate_event_message_splice_insert
                  ((DASHEventMessageBoxv1 *)
                   &segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t)next_L + 1,
                   presentation_time_00,opts.avail_interval_,opts.avail_dur_._4_4_,
                   (bool)(opts.track_id_._2_1_ & 1));
        std::
        vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
        ::push_back((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     *)&in_vtt_list.
                        super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)
                    &segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                  ((DASHEventMessageBoxv1 *)
                   &segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri_h.field_2 + 8));
    ad_start_last._0_4_ = (uint32_t)number;
    if ((opts.track_id_._1_1_ & 1) != 0) {
      ::event_track::get_meta_segment_bytes
                ((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                  *)&in_vtt_list.
                     super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,seg_start_00,seg_end_00,
                 (uint32_t)opts.avail_dur_,opts.avail_dur_._4_4_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t)ad_start_last,false);
    }
    if (((byte)opts.track_id_ & 1) != 0) {
      ::event_track::get_meta_segment_bytes
                ((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                  *)local_770,seg_start_00,seg_end_00,(uint32_t)opts.avail_dur_ + 1,
                 opts.avail_dur_._4_4_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri_h.field_2 + 8)
                 ,(uint32_t)ad_start_last,true);
    }
    if ((opts.url_.field_2._M_local_buf[8] & 1U) == 0) {
      if ((opts.track_id_._1_1_ & 1) != 0) {
        std::__cxx11::string::string
                  ((string *)local_a50,(string *)(uri_vtt.field_2._M_local_buf + 8));
        uVar7 = std::__cxx11::string::size();
        if (2 < uVar7) {
          std::operator+(&local_a90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"/");
          get_path_from_template
                    (&local_ab0,(string *)((long)&opts.init_string_.field_2 + 8),(string *)local_138
                     ,number * opts.announce_,number);
          std::operator+(&local_a70,&local_a90,&local_ab0);
          std::__cxx11::string::operator=
                    ((string *)(uri_vtt.field_2._M_local_buf + 8),(string *)&local_a70);
          std::__cxx11::string::~string((string *)&local_a70);
          std::__cxx11::string::~string((string *)&local_ab0);
          std::__cxx11::string::~string((string *)&local_a90);
          std::operator+(&local_af0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"/");
          get_path_from_template
                    ((string *)((long)&uri_vtt_h.field_2 + 8),(string *)&opts.send_vtt_,
                     (string *)local_138,0,0);
          std::operator+(&local_ad0,&local_af0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&uri_vtt_h.field_2 + 8));
          std::__cxx11::string::operator=((string *)local_a50,(string *)&local_ad0);
          std::__cxx11::string::~string((string *)&local_ad0);
          std::__cxx11::string::~string((string *)(uri_vtt_h.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_af0);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"posting event track segment to ");
        poVar5 = std::operator<<(poVar5,(string *)(uri_vtt.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)((long)&uri_vtt.field_2 + 8),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &vtt_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (CVar4 == CURLE_OK) {
          poVar5 = std::operator<<((ostream *)&std::cout,"posted segment with timed metadata bytes")
          ;
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "error posting segment with webvtt bytes, retry logic not implemented yet"
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::cout,"posting event track init segment to ");
          poVar5 = std::operator<<(poVar5,(string *)local_a50);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          CVar4 = PostCurlIngestConnection::send_curl_post
                            ((string *)local_a50,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &header_bytes_vtt.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (CVar4 != CURLE_OK) {
            exit(1);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"posting event track  segment to ");
          poVar5 = std::operator<<(poVar5,(string *)(uri_vtt.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          CVar4 = PostCurlIngestConnection::send_curl_post
                            ((string *)((long)&uri_vtt.field_2 + 8),
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &vtt_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (CVar4 != CURLE_OK) {
            exit(1);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "retry logic succeeded, segment retransmitted");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::string::~string((string *)local_a50);
      }
      if (((byte)opts.track_id_ & 1) != 0) {
        std::__cxx11::string::string((string *)local_b30,(string *)&last_L);
        lVar11 = std::__cxx11::string::size();
        if (lVar11 != 0) {
          std::operator+(&local_b70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"/");
          get_path_from_template
                    (&local_b90,(string *)((long)&opts.init_string_.field_2 + 8),(string *)local_160
                     ,number * opts.announce_,number);
          std::operator+(&local_b50,&local_b70,&local_b90);
          std::__cxx11::string::operator=((string *)&last_L,(string *)&local_b50);
          std::__cxx11::string::~string((string *)&local_b50);
          std::__cxx11::string::~string((string *)&local_b90);
          std::__cxx11::string::~string((string *)&local_b70);
          std::operator+(&local_bd0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,"/");
          get_path_from_template(&local_bf0,(string *)&opts.send_vtt_,(string *)local_160,0,0);
          std::operator+(&local_bb0,&local_bd0,&local_bf0);
          std::__cxx11::string::operator=((string *)local_b30,(string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_bf0);
          std::__cxx11::string::~string((string *)&local_bd0);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"posting vtt track  segment to ");
        poVar5 = std::operator<<(poVar5,(string *)&last_L);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        CVar4 = PostCurlIngestConnection::send_curl_post
                          ((string *)&last_L,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&uri_h.field_2 + 8));
        if (CVar4 == CURLE_OK) {
          poVar5 = std::operator<<((ostream *)&std::cout,"posted segment with vtt bytes");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "error posting segment with webvtt bytes, retry logic not implemented yet"
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::cout,"posting vtt track  init segment to ");
          poVar5 = std::operator<<(poVar5,(string *)local_b30);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          CVar4 = PostCurlIngestConnection::send_curl_post
                            ((string *)local_b30,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)&out_meta.field_2 + 8));
          if (CVar4 != CURLE_OK) {
            exit(1);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"posting vtt track  segment to ");
          poVar5 = std::operator<<(poVar5,(string *)&last_L);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          CVar4 = PostCurlIngestConnection::send_curl_post
                            ((string *)&last_L,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)&uri_h.field_2 + 8));
          if (CVar4 != CURLE_OK) {
            exit(1);
          }
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "retry logic succeeded, vtt segment retransmitted");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::string::~string((string *)local_b30);
      }
    }
    else {
      if ((opts.track_id_._1_1_ & 1) != 0) {
        ppuVar1 = &vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
        std::ostream::write(local_368,(long)pvVar6);
        std::ostream::flush();
      }
      if (((byte)opts.track_id_ & 1) != 0) {
        pvVar2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri_h.field_2 + 8)
        ;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar2,0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
        std::ostream::write(local_598,(long)pvVar6);
        std::ostream::flush();
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&uri_h.field_2 + 8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::~vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               *)local_770);
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::~vector((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               *)&in_vtt_list.
                  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uri.field_2._8_8_ = number;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    push_marker_options_t opts;
    opts.parse_options(argc, argv);

    if (!opts.send_event_ && !opts.send_vtt_) 
    {
        std::cout << "not configured to send event track or vtt track, use option --vtt when setting option --no_event" << std::endl;
        return 0;
    }
    
    uint64_t last_K = 0;
    std::string uri = opts.url_ + "/Streams(out_meta.cmfm)";
    std::string uri_vtt = opts.url_ + "/Streams(out_vtt.cmft)";
    // ad break and event characteristics
   
    uint64_t last_L = 0;
    uint64_t next_L = 0;

    std::string event_track = "events";
    std::string vtt_track = "vtt_time";

    std::fstream oft(event_track + ".cmfm" , std::ios::binary | std::ios::out);
    std::fstream oft_vtt(vtt_track + ".cmft", std::ios::binary | std::ios::out);

    std::vector<uint8_t> header_bytes;
    std::vector<uint8_t> header_bytes_vtt;

    if(opts.send_event_)
        event_track::get_meta_header_bytes(opts.track_id_, opts.timescale_, header_bytes, false);
    if(opts.send_vtt_)
        event_track::get_meta_header_bytes(opts.track_id_ + 1, opts.timescale_, header_bytes_vtt, true);
    
    if (opts.dry_run_) {
        if(opts.send_event_)
            oft.write((const char*)&header_bytes[0], header_bytes.size());
        if(opts.send_vtt_)
            oft_vtt.write((const char*)&header_bytes_vtt[0], header_bytes_vtt.size());
    }
    else {
        if (opts.send_event_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else 
            {
                std::string out_meta = "events";
                uri = opts.url_ + "/" + get_path_from_template(opts.init_string_, out_meta, 0, 0);
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
        if (opts.send_vtt_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else {
               
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                uri_vtt = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);

                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
    }
    while (1) {
        auto t = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
        //std::time_t t = std::time(0);  // t is an integer type
        uint64_t t_d = (uint64_t)t + opts.announce_;

        uint64_t next_K =  (uint64_t) std::ceil( t_d / (double) opts.seg_dur_ ); // calculate the next segment boundary
        last_L = (uint64_t)std::floor( t_d / (double) opts.avail_interval_);
        
        // the previous/current ad break (probably already ended) 
        uint64_t ad_start_last = last_L * opts.avail_interval_ ;
        uint64_t ad_end_last = ad_start_last + opts.avail_dur_ ;

        // the next ad break to announce
        uint64_t ad_start_next = (last_L + 1) * opts.avail_interval_;
        uint64_t ad_end_next = ad_start_next + opts.avail_dur_ ;

        if (next_K != last_K) {
            // fixed timescale 1000 and milliseconds based durations
            uint64_t seg_start = (uint64_t) ( next_K * opts.seg_dur_ );
            uint64_t seg_end = (uint64_t)   ( opts.seg_dur_ + seg_start);

            std::cout << " next_K is : " << next_K << std::endl;
            // std::cout << "next segment boundary is after: " << next_K * opts.seg_dur_  - t_d << " milliseconds" << std::endl;
            // std::cout << "previous tfdt was  " << t_d - last_K * opts.seg_dur_  << "  milli seconds ago" << std::endl;
            
            last_K = next_K;

            std::vector<event_track::DASHEventMessageBoxv1> in_emsg_list;
            std::vector<event_track::DASHEventMessageBoxv1> in_vtt_list;
            
            if (opts.send_vtt_) {
                
                for (unsigned int off = 0; off < opts.seg_dur_; off += 100) 
                {
                    auto ev_vtt = generate_event_message_vtt_time(
                        (uint32_t) (next_K * opts.seg_dur_ + off),
                        (uint64_t)next_K * opts.seg_dur_ + off,
                        (uint64_t)100,
                        (uint32_t)1000,
                        off
                    );

                    in_vtt_list.push_back(ev_vtt);
                }
            }
            if (opts.send_event_) {
                if (t_d < ad_end_last && t_d >= ad_start_last - opts.avail_dur_)
                {

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L,
                        (uint64_t)ad_start_last,
                        (uint64_t)opts.avail_dur_,
                        (uint32_t)opts.timescale_,
                        opts.splice_immediate_
                    );
                    std::cout << " === ad slot is active == " << std::endl;

                    in_emsg_list.push_back(ev);
                }

                if (t_d < ad_end_next && t_d >= ad_start_next - opts.avail_dur_)
                {
                    std::cout << " == ad slot is active, pushing segment with markers == " << std::endl;

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L + 1,
                        (uint64_t)ad_start_next,
                        (uint64_t)opts.avail_dur_,
                        opts.timescale_,
                        opts.splice_immediate_
                    );
                    // ev.print();

                    in_emsg_list.push_back(ev);
                }
            }
            std::vector<uint8_t> segment_bytes;
            std::vector<uint8_t> vtt_bytes;

            if (opts.send_event_) {
                event_track::get_meta_segment_bytes(
                    in_emsg_list,
                    seg_start,
                    seg_end,
                    opts.track_id_,
                    opts.timescale_,
                    segment_bytes,
                    (uint32_t)next_K,
                    false
                );
            }

            if (opts.send_vtt_) {
                event_track::get_meta_segment_bytes(
                    in_vtt_list,
                    seg_start,
                    seg_end,
                    opts.track_id_ + 1,
                    opts.timescale_,
                    vtt_bytes,
                    (uint32_t)next_K,
                    true
                );
            }

            // in case of dry run just write the output files
            if (opts.dry_run_) {
                if (opts.send_event_) {
                    oft.write((const char*)&segment_bytes[0], segment_bytes.size());
                    oft.flush();
                }
                if (opts.send_vtt_) {
                    oft_vtt.write((const char*)&vtt_bytes[0], vtt_bytes.size());
                    oft_vtt.flush();
                }
            }
            else {
                if (opts.send_event_) {
                    
                    std::string uri_h = uri;
                    
                    if (opts.media_string_.size() > 2) 
                    {  
                        uri = opts.url_ + "/" + get_path_from_template(opts.media_string_, event_track, next_K * opts.seg_dur_, next_K);
                        uri_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, event_track, 0, 0);
                    }

                    std::cout << "posting event track segment to " << uri << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with timed metadata bytes") << std::endl;
                    
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;

                        std::cout << "posting event track init segment to " << uri_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_h, header_bytes) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting event track  segment to " << uri << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                                std::cout << "retry logic succeeded, segment retransmitted" << std::endl;
                            else
                                std::exit(1);
                        }
                    }
                }
                if (opts.send_vtt_) {

                    std::string uri_vtt_h = uri_vtt;

                    if (opts.media_string_.size() > 0)
                    {
                        uri_vtt = opts.url_ + "/" + get_path_from_template(opts.media_string_, vtt_track, next_K * opts.seg_dur_, next_K);
                        uri_vtt_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);
                    }
                    std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with vtt bytes") << std::endl;
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;
                
                        std::cout << "posting vtt track  init segment to " << uri_vtt_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_vtt_h, header_bytes_vtt) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK) {
                                std::cout << "retry logic succeeded, vtt segment retransmitted" << std::endl;
                            }
                            else {
                                std::exit(1);
                            }
                        }
                    }
                }
            }
        }
    }
    std::exit(1);
}